

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScenePreprocessor.cpp
# Opt level: O2

void __thiscall
Assimp::ScenePreprocessor::ProcessAnimation(ScenePreprocessor *this,aiAnimation *anim)

{
  double dVar1;
  aiNodeAnim *paVar2;
  uint uVar3;
  aiNode *paVar4;
  aiQuatKey *paVar5;
  Logger *pLVar6;
  aiVectorKey *paVar7;
  long lVar8;
  ulong uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  aiVector3t<float> local_68;
  aiVector3t<float> local_58;
  aiQuaterniont<float> local_48;
  
  dVar14 = 100000000000.0;
  dVar13 = -100000000000.0;
  for (uVar9 = 0; uVar9 < anim->mNumChannels; uVar9 = uVar9 + 1) {
    paVar2 = anim->mChannels[uVar9];
    if ((anim->mDuration != -1.0) || (NAN(anim->mDuration))) {
      uVar3 = paVar2->mNumRotationKeys;
    }
    else {
      for (lVar8 = 0; (ulong)paVar2->mNumPositionKeys * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
        dVar1 = *(double *)((long)&paVar2->mPositionKeys->mTime + lVar8);
        uVar10 = SUB84(dVar1,0);
        uVar11 = (undefined4)((ulong)dVar1 >> 0x20);
        dVar12 = dVar1;
        if (dVar14 <= dVar1) {
          dVar12 = dVar14;
        }
        if (dVar1 <= dVar13) {
          uVar10 = SUB84(dVar13,0);
          uVar11 = (undefined4)((ulong)dVar13 >> 0x20);
        }
        dVar13 = (double)CONCAT44(uVar11,uVar10);
        dVar14 = dVar12;
      }
      for (lVar8 = 0; (ulong)paVar2->mNumScalingKeys * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
        dVar1 = *(double *)((long)&paVar2->mScalingKeys->mTime + lVar8);
        uVar10 = SUB84(dVar1,0);
        uVar11 = (undefined4)((ulong)dVar1 >> 0x20);
        dVar12 = dVar1;
        if (dVar14 <= dVar1) {
          dVar12 = dVar14;
        }
        if (dVar1 <= dVar13) {
          uVar10 = SUB84(dVar13,0);
          uVar11 = (undefined4)((ulong)dVar13 >> 0x20);
        }
        dVar13 = (double)CONCAT44(uVar11,uVar10);
        dVar14 = dVar12;
      }
      uVar3 = paVar2->mNumRotationKeys;
      for (lVar8 = 0; (ulong)uVar3 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
        dVar1 = *(double *)((long)&paVar2->mRotationKeys->mTime + lVar8);
        uVar10 = SUB84(dVar1,0);
        uVar11 = (undefined4)((ulong)dVar1 >> 0x20);
        dVar12 = dVar1;
        if (dVar14 <= dVar1) {
          dVar12 = dVar14;
        }
        if (dVar1 <= dVar13) {
          uVar10 = SUB84(dVar13,0);
          uVar11 = (undefined4)((ulong)dVar13 >> 0x20);
        }
        dVar13 = (double)CONCAT44(uVar11,uVar10);
        dVar14 = dVar12;
      }
    }
    if (((uVar3 == 0) || (paVar2->mNumPositionKeys == 0)) || (paVar2->mNumScalingKeys == 0)) {
      paVar4 = aiNode::FindNode(this->scene->mRootNode,(paVar2->mNodeName).data);
      if (paVar4 != (aiNode *)0x0) {
        local_58.x = 0.0;
        local_58.y = 0.0;
        local_58.z = 0.0;
        local_68.x = 0.0;
        local_68.y = 0.0;
        local_68.z = 0.0;
        local_48.w = 1.0;
        local_48.x = 0.0;
        local_48.y = 0.0;
        local_48.z = 0.0;
        aiMatrix4x4t<float>::Decompose(&paVar4->mTransformation,&local_58,&local_48,&local_68);
        if (paVar2->mNumRotationKeys == 0) {
          paVar2->mNumRotationKeys = 1;
          paVar5 = (aiQuatKey *)operator_new__(0x18);
          paVar2->mRotationKeys = paVar5;
          paVar5->mTime = 0.0;
          (paVar5->mValue).w = local_48.w;
          (paVar5->mValue).x = local_48.x;
          (paVar5->mValue).y = local_48.y;
          (paVar5->mValue).z = local_48.z;
          pLVar6 = DefaultLogger::get();
          Logger::debug(pLVar6,"ScenePreprocessor: Dummy rotation track has been generated");
        }
        if (paVar2->mNumScalingKeys == 0) {
          paVar2->mNumScalingKeys = 1;
          paVar7 = (aiVectorKey *)operator_new__(0x18);
          paVar2->mScalingKeys = paVar7;
          paVar7->mTime = 0.0;
          (paVar7->mValue).x = local_58.x;
          (paVar7->mValue).y = local_58.y;
          (paVar7->mValue).z = local_58.z;
          pLVar6 = DefaultLogger::get();
          Logger::debug(pLVar6,"ScenePreprocessor: Dummy scaling track has been generated");
        }
        if (paVar2->mNumPositionKeys == 0) {
          paVar2->mNumPositionKeys = 1;
          paVar7 = (aiVectorKey *)operator_new__(0x18);
          paVar2->mPositionKeys = paVar7;
          paVar7->mTime = 0.0;
          (paVar7->mValue).x = local_68.x;
          (paVar7->mValue).y = local_68.y;
          (paVar7->mValue).z = local_68.z;
          pLVar6 = DefaultLogger::get();
          Logger::debug(pLVar6,"ScenePreprocessor: Dummy position track has been generated");
        }
      }
    }
  }
  if ((anim->mDuration == -1.0) && (!NAN(anim->mDuration))) {
    pLVar6 = DefaultLogger::get();
    Logger::debug(pLVar6,"ScenePreprocessor: Setting animation duration");
    uVar10 = 0;
    uVar11 = 0;
    if (dVar14 <= 0.0) {
      uVar10 = SUB84(dVar14,0);
      uVar11 = (undefined4)((ulong)dVar14 >> 0x20);
    }
    anim->mDuration = dVar13 - (double)CONCAT44(uVar11,uVar10);
  }
  return;
}

Assistant:

void ScenePreprocessor::ProcessAnimation (aiAnimation* anim)
{
    double first = 10e10, last = -10e10;
    for (unsigned int i = 0; i < anim->mNumChannels;++i)    {
        aiNodeAnim* channel = anim->mChannels[i];

        /*  If the exact duration of the animation is not given
         *  compute it now.
         */
        if (anim->mDuration == -1.) {

            // Position keys
            for (unsigned int j = 0; j < channel->mNumPositionKeys;++j) {
                aiVectorKey& key = channel->mPositionKeys[j];
                first = std::min (first, key.mTime);
                last  = std::max (last,  key.mTime);
            }

            // Scaling keys
            for (unsigned int j = 0; j < channel->mNumScalingKeys;++j )  {
                aiVectorKey& key = channel->mScalingKeys[j];
                first = std::min (first, key.mTime);
                last  = std::max (last,  key.mTime);
            }

            // Rotation keys
            for (unsigned int j = 0; j < channel->mNumRotationKeys;++j ) {
                aiQuatKey& key = channel->mRotationKeys[ j ];
                first = std::min (first, key.mTime);
                last  = std::max (last,  key.mTime);
            }
        }

        /*  Check whether the animation channel has no rotation
         *  or position tracks. In this case we generate a dummy
         *  track from the information we have in the transformation
         *  matrix of the corresponding node.
         */
        if (!channel->mNumRotationKeys || !channel->mNumPositionKeys || !channel->mNumScalingKeys)  {
            // Find the node that belongs to this animation
            aiNode* node = scene->mRootNode->FindNode(channel->mNodeName);
            if (node) // ValidateDS will complain later if 'node' is NULL
            {
                // Decompose the transformation matrix of the node
                aiVector3D scaling, position;
                aiQuaternion rotation;

                node->mTransformation.Decompose(scaling, rotation,position);

                // No rotation keys? Generate a dummy track
                if (!channel->mNumRotationKeys) {
                    channel->mNumRotationKeys = 1;
                    channel->mRotationKeys = new aiQuatKey[1];
                    aiQuatKey& q = channel->mRotationKeys[0];

                    q.mTime  = 0.;
                    q.mValue = rotation;

                    ASSIMP_LOG_DEBUG("ScenePreprocessor: Dummy rotation track has been generated");
                }

                // No scaling keys? Generate a dummy track
                if (!channel->mNumScalingKeys)  {
                    channel->mNumScalingKeys = 1;
                    channel->mScalingKeys = new aiVectorKey[1];
                    aiVectorKey& q = channel->mScalingKeys[0];

                    q.mTime  = 0.;
                    q.mValue = scaling;

                    ASSIMP_LOG_DEBUG("ScenePreprocessor: Dummy scaling track has been generated");
                }

                // No position keys? Generate a dummy track
                if (!channel->mNumPositionKeys) {
                    channel->mNumPositionKeys = 1;
                    channel->mPositionKeys = new aiVectorKey[1];
                    aiVectorKey& q = channel->mPositionKeys[0];

                    q.mTime  = 0.;
                    q.mValue = position;

                    ASSIMP_LOG_DEBUG("ScenePreprocessor: Dummy position track has been generated");
                }
            }
        }
    }

    if (anim->mDuration == -1.)     {
        ASSIMP_LOG_DEBUG("ScenePreprocessor: Setting animation duration");
        anim->mDuration = last - std::min( first, 0. );
    }
}